

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Module>::RefPtr
          (RefPtr<wabt::interp::Module> *this,Store *store,Ref ref)

{
  ObjectKind OVar1;
  Object *pOVar2;
  Module *pMVar3;
  long lVar4;
  long lVar5;
  Index IVar6;
  FuncType *pFVar7;
  new_allocator<wabt::interp::FuncType> *this_00;
  size_type __n;
  
  pOVar2 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar2 & 1) == 0) {
    OVar1 = pOVar2->kind_;
    if (OVar1 != Module) {
      if (ref.index == 0) {
        OVar1 = First;
      }
      this_00 = (new_allocator<wabt::interp::FuncType> *)(ulong)OVar1;
      interp::RefPtr((interp *)this_00);
      lVar4 = *(long *)&(store->features_).tail_call_enabled_;
      lVar5 = *(long *)&store->features_;
      __n = lVar4 - lVar5 >> 6;
      *(undefined8 *)this_00 = 0;
      *(undefined8 *)(this_00 + 8) = 0;
      *(undefined8 *)(this_00 + 0x10) = 0;
      if (lVar4 == lVar5) {
        pFVar7 = (FuncType *)0x0;
      }
      else {
        pFVar7 = __gnu_cxx::new_allocator<wabt::interp::FuncType>::allocate(this_00,__n,(void *)0x0)
        ;
      }
      *(FuncType **)this_00 = pFVar7;
      *(FuncType **)(this_00 + 8) = pFVar7;
      *(FuncType **)(this_00 + 0x10) = pFVar7 + __n;
      pFVar7 = std::__uninitialized_copy<false>::
               __uninit_copy<__gnu_cxx::__normal_iterator<wabt::interp::FuncType_const*,std::vector<wabt::interp::FuncType,std::allocator<wabt::interp::FuncType>>>,wabt::interp::FuncType*>
                         (*(FuncType **)&store->features_,
                          *(FuncType **)&(store->features_).tail_call_enabled_,pFVar7);
      *(FuncType **)(this_00 + 8) = pFVar7;
      return;
    }
    IVar6 = Store::NewRoot(store,ref);
    this->root_index_ = IVar6;
    pMVar3 = (Module *)
             (store->objects_).list_.
             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
             _M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pMVar3 & 1) == 0) {
      this->obj_ = pMVar3;
      this->store_ = store;
      return;
    }
  }
  else if (ref.index == 0) {
    interp::RefPtr((interp *)0x0);
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe6,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}